

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

void __thiscall
Js::JavascriptPromiseAllResolveElementFunction::JavascriptPromiseAllResolveElementFunction
          (JavascriptPromiseAllResolveElementFunction *this,DynamicType *type,
          FunctionInfo *functionInfo,uint32 index,JavascriptArray *values,
          JavascriptPromiseCapability *capabilities,
          JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper
          *remainingElementsWrapper)

{
  JavascriptPromiseCapability *capabilities_local;
  JavascriptArray *values_local;
  uint32 index_local;
  FunctionInfo *functionInfo_local;
  DynamicType *type_local;
  JavascriptPromiseAllResolveElementFunction *this_local;
  
  RuntimeFunction::RuntimeFunction(&this->super_RuntimeFunction,type,functionInfo);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01e3ab18;
  Memory::WriteBarrierPtr<Js::JavascriptPromiseCapability>::WriteBarrierPtr
            (&this->capabilities,capabilities);
  this->index = index;
  Memory::WriteBarrierPtr<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>::
  WriteBarrierPtr(&this->remainingElementsWrapper,remainingElementsWrapper);
  Memory::WriteBarrierPtr<Js::JavascriptArray>::WriteBarrierPtr(&this->values,values);
  this->alreadyCalled = false;
  return;
}

Assistant:

JavascriptPromiseAllResolveElementFunction::JavascriptPromiseAllResolveElementFunction(DynamicType* type, FunctionInfo* functionInfo, uint32 index, JavascriptArray* values, JavascriptPromiseCapability* capabilities, JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingElementsWrapper)
        : RuntimeFunction(type, functionInfo), index(index), values(values), capabilities(capabilities), remainingElementsWrapper(remainingElementsWrapper), alreadyCalled(false)
    { }